

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O1

void __thiscall OpenMD::EAM::addType(EAM *this,AtomType *atomType)

{
  pointer pEVar1;
  undefined8 *puVar2;
  pointer pEVar3;
  long lVar4;
  double dVar5;
  pointer pdVar6;
  RealType RVar7;
  uint uVar8;
  undefined8 this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  ulong uVar10;
  bool bVar11;
  EAMType EVar12;
  int iVar13;
  int i_1;
  _Base_ptr p_Var14;
  EAM *pEVar15;
  long lVar16;
  int i;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  _Rb_tree_node_base *p_Var19;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar20;
  pair<double,_double> pVar21;
  EAMAdapter ea;
  RealType rho;
  RealType r;
  vector<double,_std::allocator<double>_> funcvals_1;
  vector<double,_std::allocator<double>_> funcvals;
  vector<double,_std::allocator<double>_> rhovals;
  vector<double,_std::allocator<double>_> cvvals;
  int atid;
  FluctuatingChargeAdapter fqa;
  vector<double,_std::allocator<double>_> F;
  vector<double,_std::allocator<double>_> Fn;
  RealType phiCV_1;
  RealType phiCV;
  RealType phiCC;
  EAMAdapter local_370;
  undefined1 local_361;
  _Rb_tree_node_base *local_360;
  RealType local_358;
  _Rb_tree_node_base *local_350;
  AtomType *local_348;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_340 [2];
  RealType local_330;
  vector<double,_std::allocator<double>_> local_328;
  vector<double,_std::allocator<double>_> local_308;
  vector<double,_std::allocator<double>_> local_2e8;
  _Base_ptr local_2d0;
  vector<double,_std::allocator<double>_> local_2c8;
  EAM *local_2b0;
  vector<double,_std::allocator<double>_> local_2a8;
  vector<double,_std::allocator<double>_> local_288;
  undefined1 local_268 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_260;
  double *local_258;
  double local_250;
  _Base_ptr local_248;
  _Base_ptr local_240;
  undefined1 local_238 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  pointer local_218;
  undefined1 uStack_210;
  undefined7 uStack_20f;
  undefined1 local_208;
  undefined7 uStack_207;
  undefined1 local_200;
  pointer local_1f0;
  pointer local_1e8;
  RealType local_1e0;
  ForceField *local_1d8;
  Electrostatic *local_1d0;
  RealType local_1c8;
  RealType local_1c0;
  _Rb_tree_node_base *local_1b8;
  AtomType *local_1b0;
  AtomType *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  AtomType *local_198;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_190;
  AtomType *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_180;
  AtomType *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  _Alloc_hider local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148;
  undefined7 uStack_147;
  undefined1 local_140;
  RealType local_130;
  undefined1 local_128 [16];
  ulong local_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_f0;
  undefined1 local_d8 [24];
  vector<double,_std::allocator<double>_> local_c0;
  undefined1 local_a8 [24];
  vector<double,_std::allocator<double>_> local_90;
  undefined1 local_78 [24];
  vector<double,_std::allocator<double>_> local_60;
  
  local_168._M_p = (pointer)0x0;
  _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_178 = (AtomType *)0x0;
  _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_188 = (AtomType *)0x0;
  _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_198 = (AtomType *)0x0;
  _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1a8 = (AtomType *)0x0;
  _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_370.at_ = atomType;
  local_1b0 = atomType;
  EVar12 = EAMAdapter::getEAMType(&local_370);
  local_2b0 = this;
  switch((ulong)EVar12) {
  case 0:
    EAMAdapter::getRhoSpline((EAMAdapter *)local_238);
    _Var9._M_pi = _Stack_1a0._M_pi;
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_;
    local_1a8 = (AtomType *)local_238._0_8_;
    local_238._0_8_ = (AtomType *)0x0;
    local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    EAMAdapter::getFSpline((EAMAdapter *)local_238);
    _Var9._M_pi = _Stack_190._M_pi;
    _Stack_190._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_;
    local_198 = (AtomType *)local_238._0_8_;
    local_238._0_8_ = (AtomType *)0x0;
    local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    EAMAdapter::getZSpline((EAMAdapter *)local_238);
    _Var9._M_pi = _Stack_180._M_pi;
    _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_;
    local_188 = (AtomType *)local_238._0_8_;
    local_238._0_8_ = (AtomType *)0x0;
    local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    local_158._M_allocated_capacity = (size_type)EAMAdapter::getRcut(&local_370);
    break;
  case 1:
  case 2:
  case 3:
  case 5:
    local_360 = (_Rb_tree_node_base *)EAMAdapter::getRe(&local_370);
    local_2d0 = (_Base_ptr)EAMAdapter::get_fe(&local_370);
    local_240 = (_Base_ptr)EAMAdapter::getRhoe(&local_370);
    local_1c8 = EAMAdapter::getA(&local_370);
    local_1d0 = (Electrostatic *)EAMAdapter::getB(&local_370);
    local_1d8 = (ForceField *)EAMAdapter::getAlpha(&local_370);
    local_358 = EAMAdapter::getBeta(&local_370);
    local_1e0 = EAMAdapter::getKappa(&local_370);
    local_330 = EAMAdapter::getLambda(&local_370);
    EAMAdapter::getFn((vector<double,_std::allocator<double>_> *)local_238,&local_370);
    EAMAdapter::getF((vector<double,_std::allocator<double>_> *)local_268,&local_370);
    local_1e8 = (pointer)EAMAdapter::getFe(&local_370);
    local_130 = EAMAdapter::getEta(&local_370);
    local_110 = (ulong)EVar12;
    RVar7 = EAMAdapter::getF0(&local_370);
    local_128._8_4_ = extraout_XMM0_Dc;
    local_128._0_8_ = RVar7;
    local_128._12_4_ = extraout_XMM0_Dd;
    local_158._M_allocated_capacity = (size_type)((double)local_360 * 4.0);
    if ((double)local_158._M_allocated_capacity <= 9.0) {
      local_158._M_allocated_capacity = (size_type)9.0;
    }
    if (12.0 <= (double)local_158._M_allocated_capacity) {
      local_158._M_allocated_capacity = (size_type)12.0;
    }
    local_248 = (_Base_ptr)((double)local_158._M_allocated_capacity / 1999.0);
    local_250 = (double)local_240 + (double)local_240;
    RVar7 = Rho(this,0.0,(RealType)local_360,(RealType)local_2d0,local_358,local_330);
    pEVar15 = local_2b0;
    uVar17 = SUB84(RVar7,0);
    uVar18 = (undefined4)((ulong)RVar7 >> 0x20);
    if (RVar7 <= local_250) {
      uVar17 = SUB84(local_250,0);
      uVar18 = (undefined4)((ulong)local_250 >> 0x20);
    }
    if ((double)CONCAT44(uVar18,uVar17) <= 900.0) {
      uVar17 = 0;
      uVar18 = 0x408c2000;
    }
    local_250 = (double)CONCAT44(uVar18,uVar17) / 2999.0;
    iVar13 = 0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    do {
      local_348 = (AtomType *)((double)iVar13 * (double)local_248);
      if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_288,
                   (iterator)
                   local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_348);
      }
      else {
        *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_348;
        local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)Rho(local_2b0,(RealType)local_348,(RealType)local_360,(RealType)local_2d0,
                              local_358,local_330);
      if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_2e8,
                   (iterator)
                   local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_328);
      }
      else {
        *local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (double)local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_1b8 = (_Rb_tree_node_base *)
                  PhiCoreCore(pEVar15,(RealType)local_348,(RealType)local_360,local_1c8,
                              (RealType)local_1d8,local_1e0);
      local_1c0 = PhiCoreValence(pEVar15,(RealType)local_348,(RealType)local_360,(RealType)local_1d0
                                 ,local_358,local_330);
      if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_2a8,
                   (iterator)
                   local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_1b8);
      }
      else {
        *local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_1b8;
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_2c8,
                   (iterator)
                   local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1c0);
      }
      else {
        *local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_1c0;
        local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != 2000);
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish,(CubicSpline **)&local_328,
               (allocator<OpenMD::CubicSpline> *)&local_1f0);
    uVar10 = local_110;
    _Var9._M_pi = _Stack_1a0._M_pi;
    _Stack_1a0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1a8 = (AtomType *)
                local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    CubicSpline::addPoints((CubicSpline *)local_1a8,&local_288,&local_2e8);
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish,(CubicSpline **)&local_328,
               (allocator<OpenMD::CubicSpline> *)&local_1f0);
    _Var9._M_pi = _Stack_170._M_pi;
    _Stack_170._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_178 = (AtomType *)
                local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    CubicSpline::addPoints((CubicSpline *)local_178,&local_288,&local_2a8);
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish,(CubicSpline **)&local_328,
               (allocator<OpenMD::CubicSpline> *)&local_1f0);
    _Var9._M_pi = _Stack_160._M_pi;
    _Stack_160._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_168._M_p =
         (pointer)local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    CubicSpline::addPoints((CubicSpline *)local_168._M_p,&local_288,&local_2c8);
    if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    switch((int)uVar10) {
    case 1:
      iVar13 = 0;
      do {
        local_350 = (_Rb_tree_node_base *)((double)iVar13 * local_250);
        if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_2e8,
                     (iterator)
                     local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_350);
        }
        else {
          *local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_350;
          local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_360 = local_350;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_60,(vector<double,_std::allocator<double>_> *)local_238);
        pEVar15 = (EAM *)local_78;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_78,
                   (vector<double,_std::allocator<double>_> *)local_268);
        local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)Zhou2001Functional(pEVar15,(RealType)local_360,(RealType)local_240,&local_60,
                                         (vector<double,_std::allocator<double>_> *)local_78,
                                         (RealType)local_1e8,local_130);
        if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_308,
                     (iterator)
                     local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_328);
        }
        else {
          *local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (double)local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if ((_func_int **)local_78._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
        }
        if ((pointer)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != 3000);
      break;
    case 2:
      local_358 = EAMAdapter::getRhos(&local_370);
      local_330 = EAMAdapter::getRhol(&local_370);
      local_2d0 = (_Base_ptr)EAMAdapter::getRhoh(&local_370);
      iVar13 = 0;
      do {
        local_350 = (_Rb_tree_node_base *)((double)iVar13 * local_250);
        if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_2e8,
                     (iterator)
                     local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_350);
        }
        else {
          *local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_350;
          local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_360 = local_350;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_90,(vector<double,_std::allocator<double>_> *)local_238);
        pEVar15 = (EAM *)local_a8;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_a8,
                   (vector<double,_std::allocator<double>_> *)local_268);
        local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)Zhou2004Functional(pEVar15,(RealType)local_360,(RealType)local_240,local_358,
                                         &local_90,
                                         (vector<double,_std::allocator<double>_> *)local_a8,
                                         (RealType)local_1e8,local_130,local_330,(RealType)local_2d0
                                        );
        if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_308,
                     (iterator)
                     local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_328);
        }
        else {
          *local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (double)local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if ((_Base_ptr)local_a8._0_8_ != (_Base_ptr)0x0) {
          operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
        }
        if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != 3000);
      break;
    case 3:
      local_358 = EAMAdapter::getRhos(&local_370);
      local_330 = EAMAdapter::getF3plus(&local_370);
      local_2d0 = (_Base_ptr)EAMAdapter::getF3minus(&local_370);
      iVar13 = 0;
      do {
        local_350 = (_Rb_tree_node_base *)((double)iVar13 * local_250);
        if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_2e8,
                     (iterator)
                     local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_350);
        }
        else {
          *local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_350;
          local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_360 = local_350;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_c0,(vector<double,_std::allocator<double>_> *)local_238);
        pEVar15 = (EAM *)local_d8;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_d8,
                   (vector<double,_std::allocator<double>_> *)local_268);
        local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)Zhou2005Functional(pEVar15,(RealType)local_360,(RealType)local_240,local_358,
                                         &local_c0,
                                         (vector<double,_std::allocator<double>_> *)local_d8,
                                         local_330,(RealType)local_2d0,(RealType)local_1e8,local_130
                                        );
        if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_308,
                     (iterator)
                     local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_328);
        }
        else {
          *local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (double)local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if ((_func_int **)local_d8._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
        }
        if (local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_c0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != 3000);
      break;
    case 5:
      uVar8 = local_128._12_4_;
      local_128._0_8_ = local_128._0_8_ ^ 0x8000000000000000;
      local_128._12_4_ = uVar8 ^ 0x80000000;
      iVar13 = 0;
      do {
        local_350 = (_Rb_tree_node_base *)((double)iVar13 * local_250);
        if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_2e8,
                     (iterator)
                     local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_350);
        }
        else {
          *local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_350;
          local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        p_Var19 = (_Rb_tree_node_base *)((double)local_350 / (double)local_240);
        pdVar6 = (pointer)0x0;
        if (0.0 < (double)p_Var19) {
          local_360 = p_Var19;
          dVar5 = log((double)p_Var19);
          pdVar6 = (pointer)(dVar5 * (double)local_128._0_8_ * (double)local_360);
        }
        local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = pdVar6;
        if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_308,
                     (iterator)
                     local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_328);
        }
        else {
          *local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)pdVar6;
          local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 != 3000);
    }
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish,(CubicSpline **)&local_328,
               (allocator<OpenMD::CubicSpline> *)&local_1f0);
    _Var9._M_pi = _Stack_190._M_pi;
    this = local_2b0;
    _Stack_190._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_198 = (AtomType *)
                local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    CubicSpline::addPoints((CubicSpline *)local_198,&local_2e8,&local_308);
    if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    goto LAB_0022e6b9;
  case 4:
    local_360 = (_Rb_tree_node_base *)EAMAdapter::getRe(&local_370);
    local_358 = EAMAdapter::get_fe(&local_370);
    local_1c8 = EAMAdapter::getA(&local_370);
    local_1d0 = (Electrostatic *)EAMAdapter::getB(&local_370);
    local_1d8 = (ForceField *)EAMAdapter::getAlpha(&local_370);
    local_1e0 = EAMAdapter::getBeta(&local_370);
    local_240 = (_Base_ptr)EAMAdapter::getKappa(&local_370);
    local_250 = EAMAdapter::getLambda(&local_370);
    local_330 = EAMAdapter::getGamma(&local_370);
    local_2d0 = (_Base_ptr)EAMAdapter::getNu(&local_370);
    EAMAdapter::getOrhoLimits((vector<double,_std::allocator<double>_> *)local_238,&local_370);
    EAMAdapter::getOrhoE((vector<double,_std::allocator<double>_> *)local_268,&local_370);
    EAMAdapter::getOF((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)&local_288,&local_370);
    local_158._M_allocated_capacity = (size_type)((double)local_360 * 4.0);
    if ((double)local_158._M_allocated_capacity <= 9.0) {
      local_158._M_allocated_capacity = (size_type)9.0;
    }
    if (12.0 <= (double)local_158._M_allocated_capacity) {
      local_158._M_allocated_capacity = (size_type)12.0;
    }
    local_248 = (_Base_ptr)((double)local_158._M_allocated_capacity / 1999.0);
    RVar7 = Rho(this,0.0,(RealType)local_360,local_358,local_330,(RealType)local_2d0);
    pEVar15 = local_2b0;
    uVar17 = SUB84(RVar7,0);
    uVar18 = (undefined4)((ulong)RVar7 >> 0x20);
    if (RVar7 <= 800.0) {
      uVar17 = 0;
      uVar18 = 0x40890000;
    }
    local_1e8 = (pointer)((double)CONCAT44(uVar18,uVar17) / 2999.0);
    iVar13 = 0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    do {
      local_350 = (_Rb_tree_node_base *)((double)iVar13 * (double)local_248);
      if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_2a8,
                   (iterator)
                   local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_350);
      }
      else {
        *local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_350;
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_348 = (AtomType *)
                  Rho(local_2b0,(RealType)local_350,(RealType)local_360,local_358,local_330,
                      (RealType)local_2d0);
      if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_308,
                   (iterator)
                   local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_348);
      }
      else {
        *local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_348;
        local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_1c0 = PhiCoreCore(pEVar15,(RealType)local_350,(RealType)local_360,local_1c8,
                              (RealType)local_1d8,(RealType)local_240);
      local_1f0 = (pointer)PhiCoreValence(pEVar15,(RealType)local_350,(RealType)local_360,
                                          (RealType)local_1d0,local_1e0,local_250);
      if (local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_2c8,
                   (iterator)
                   local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_1c0);
      }
      else {
        *local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_1c0;
        local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_2e8,
                   (iterator)
                   local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_1f0);
      }
      else {
        *local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_1f0;
        local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != 2000);
    local_348 = (AtomType *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              (a_Stack_340,(CubicSpline **)&local_348,(allocator<OpenMD::CubicSpline> *)&local_361);
    _Var9._M_pi = _Stack_1a0._M_pi;
    _Stack_1a0._M_pi = a_Stack_340[0]._M_pi;
    local_1a8 = local_348;
    local_348 = (AtomType *)0x0;
    a_Stack_340[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if (a_Stack_340[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_340[0]._M_pi);
    }
    CubicSpline::addPoints((CubicSpline *)local_1a8,&local_2a8,&local_308);
    local_348 = (AtomType *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              (a_Stack_340,(CubicSpline **)&local_348,(allocator<OpenMD::CubicSpline> *)&local_361);
    _Var9._M_pi = _Stack_170._M_pi;
    _Stack_170._M_pi = a_Stack_340[0]._M_pi;
    local_178 = local_348;
    local_348 = (AtomType *)0x0;
    a_Stack_340[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if (a_Stack_340[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_340[0]._M_pi);
    }
    CubicSpline::addPoints((CubicSpline *)local_178,&local_2a8,&local_2c8);
    local_348 = (AtomType *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              (a_Stack_340,(CubicSpline **)&local_348,(allocator<OpenMD::CubicSpline> *)&local_361);
    _Var9._M_pi = _Stack_160._M_pi;
    _Stack_160._M_pi = a_Stack_340[0]._M_pi;
    local_168._M_p = (pointer)local_348;
    local_348 = (AtomType *)0x0;
    a_Stack_340[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if (a_Stack_340[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_340[0]._M_pi);
    }
    CubicSpline::addPoints((CubicSpline *)local_168._M_p,&local_2a8,&local_2e8);
    if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    iVar13 = 0;
    do {
      local_1b8 = (_Rb_tree_node_base *)((double)iVar13 * (double)local_1e8);
      if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_308,
                   (iterator)
                   local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_1b8);
      }
      else {
        *local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_1b8;
        local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_360 = local_1b8;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_f0,(vector<double,_std::allocator<double>_> *)local_238);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_108,(vector<double,_std::allocator<double>_> *)local_268);
      pEVar15 = (EAM *)&stack0xffffffffffffffb8;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&stack0xffffffffffffffb8,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)&local_288);
      local_348 = (AtomType *)
                  Zhou2005OxygenFunctional
                            (pEVar15,(RealType)local_360,&local_f0,&local_108,
                             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)&stack0xffffffffffffffb8);
      if (local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_328,
                   (iterator)
                   local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_348);
      }
      else {
        *local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_348;
        local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&stack0xffffffffffffffb8);
      if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != 3000);
    local_348 = (AtomType *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              (a_Stack_340,(CubicSpline **)&local_348,(allocator<OpenMD::CubicSpline> *)&local_361);
    _Var9._M_pi = _Stack_190._M_pi;
    this = local_2b0;
    _Stack_190._M_pi = a_Stack_340[0]._M_pi;
    local_198 = local_348;
    local_348 = (AtomType *)0x0;
    a_Stack_340[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if (a_Stack_340[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_340[0]._M_pi);
    }
    CubicSpline::addPoints((CubicSpline *)local_198,&local_308,&local_328);
    if (local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&local_288);
    goto LAB_0022e6f3;
  case 6:
    local_360 = (_Rb_tree_node_base *)EAMAdapter::getRe(&local_370);
    local_248 = (_Base_ptr)EAMAdapter::get_fe(&local_370);
    local_1c8 = EAMAdapter::getA(&local_370);
    local_1d0 = (Electrostatic *)EAMAdapter::getB(&local_370);
    local_1d8 = (ForceField *)EAMAdapter::getAlpha(&local_370);
    local_358 = EAMAdapter::getBeta(&local_370);
    local_1e0 = EAMAdapter::getKappa(&local_370);
    local_330 = EAMAdapter::getLambda(&local_370);
    pEVar15 = local_2b0;
    local_158._M_allocated_capacity = (size_type)((double)local_360 * 4.0);
    if ((double)local_158._M_allocated_capacity <= 9.0) {
      local_158._M_allocated_capacity = (size_type)9.0;
    }
    if (12.0 <= (double)local_158._M_allocated_capacity) {
      local_158._M_allocated_capacity = (size_type)12.0;
    }
    local_2d0 = (_Base_ptr)((double)local_158._M_allocated_capacity / 1999.0);
    iVar13 = 0;
    local_238._16_8_ = (double *)0x0;
    local_238._0_8_ = (AtomType *)0x0;
    local_238._8_8_ = (double *)0x0;
    local_258 = (double *)0x0;
    local_268 = (undefined1  [8])0x0;
    p_Stack_260 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    do {
      local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((double)iVar13 * (double)local_2d0);
      if (local_238._8_8_ == local_238._16_8_) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)local_238,(iterator)local_238._8_8_,
                   (double *)&local_2e8);
      }
      else {
        *(pointer *)local_238._8_8_ =
             local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_238._8_8_ = local_238._8_8_ + 8;
      }
      local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)Rho(local_2b0,
                              (RealType)
                              local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,(RealType)local_360,
                              (RealType)local_248,local_358,local_330);
      if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_2a8,
                   (iterator)
                   local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_2c8);
      }
      else {
        *local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (double)local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)PhiCoreCore(pEVar15,(RealType)
                                              local_2e8.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start,
                                      (RealType)local_360,local_1c8,(RealType)local_1d8,local_1e0);
      local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)PhiCoreValence(pEVar15,(RealType)
                                                 local_2e8.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start,
                                         (RealType)local_360,(RealType)local_1d0,local_358,local_330
                                        );
      if (p_Stack_260 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)local_268,(iterator)p_Stack_260,
                   (double *)&local_308);
      }
      else {
        *(pointer *)p_Stack_260 =
             local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        p_Stack_260 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)p_Stack_260 + 8);
      }
      if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_288,
                   (iterator)
                   local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_328);
      }
      else {
        *local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (double)local_328.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != 2000);
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish,(CubicSpline **)&local_2c8,
               (allocator<OpenMD::CubicSpline> *)&local_348);
    _Var9._M_pi = _Stack_1a0._M_pi;
    this = local_2b0;
    _Stack_1a0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1a8 = (AtomType *)
                local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    CubicSpline::addPoints
              ((CubicSpline *)local_1a8,(vector<double,_std::allocator<double>_> *)local_238,
               &local_2a8);
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish,(CubicSpline **)&local_2c8,
               (allocator<OpenMD::CubicSpline> *)&local_348);
    _Var9._M_pi = _Stack_170._M_pi;
    _Stack_170._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_178 = (AtomType *)
                local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    CubicSpline::addPoints
              ((CubicSpline *)local_178,(vector<double,_std::allocator<double>_> *)local_238,
               (vector<double,_std::allocator<double>_> *)local_268);
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish,(CubicSpline **)&local_2c8,
               (allocator<OpenMD::CubicSpline> *)&local_348);
    _Var9._M_pi = _Stack_160._M_pi;
    _Stack_160._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_168._M_p =
         (pointer)local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    CubicSpline::addPoints
              ((CubicSpline *)local_168._M_p,(vector<double,_std::allocator<double>_> *)local_238,
               &local_288);
    EAMAdapter::getFSpline((EAMAdapter *)&local_2c8);
    _Var9._M_pi = _Stack_190._M_pi;
    _Stack_190._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_198 = (AtomType *)
                local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
LAB_0022e6b9:
    if (local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
LAB_0022e6f3:
    if (local_268 != (undefined1  [8])0x0) {
      operator_delete((void *)local_268,(long)local_258 - (long)local_268);
    }
    if ((AtomType *)local_238._0_8_ != (AtomType *)0x0) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ - local_238._0_8_);
    }
    break;
  case 7:
    AtomType::getName_abi_cxx11_((string *)local_238,local_1b0);
    snprintf(painCave.errMsg,2000,"EAM::addType found an unknown EAM type for atomType %s\n",
             local_238._0_8_);
    if ((AtomType *)local_238._0_8_ != (AtomType *)(local_238 + 0x10)) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b0;
  bVar11 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)&local_288);
  if ((bVar11) &&
     (bVar11 = FluctuatingChargeAdapter::isMetallic((FluctuatingChargeAdapter *)&local_288), bVar11)
     ) {
    local_140 = 1;
    RVar7 = FluctuatingChargeAdapter::getNValence((FluctuatingChargeAdapter *)&local_288);
    local_158._M_local_buf[8] = SUB81(RVar7,0);
    local_158._9_7_ = (undefined7)((ulong)RVar7 >> 8);
    RVar7 = FluctuatingChargeAdapter::getNMobile((FluctuatingChargeAdapter *)&local_288);
    local_148 = SUB81(RVar7,0);
    uStack_147 = (undefined7)((ulong)RVar7 >> 8);
  }
  else {
    local_140 = 0;
  }
  iVar13 = AtomType::getIdent(local_1b0);
  local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start._4_4_,iVar13);
  local_358 = (RealType)(this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar20 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
           _M_insert_unique<int_const&>
                     ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                      &this->EAMtypes,(int *)&local_2a8);
  if (pVar20.second == false) {
    snprintf(painCave.errMsg,2000,"EAM already had a previous entry with ident %d\n",
             (ulong)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start & 0xffffffff);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)local_2a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start] = SUB84(local_358,0);
  p_Var14 = (_Base_ptr)(long)SUB84(local_358,0);
  pEVar3 = (this->EAMdata).
           super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = pEVar3 + (long)p_Var14;
  (pEVar1->rho).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1a8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pEVar1->rho).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&_Stack_1a0);
  (pEVar1->F).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_198;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&pEVar3[(long)p_Var14].F.
              super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &_Stack_190);
  pEVar3[(long)p_Var14].Z.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_188;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&pEVar3[(long)p_Var14].Z.
              super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &_Stack_180);
  pEVar3[(long)p_Var14].phiCC.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_178;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&pEVar3[(long)p_Var14].phiCC.
              super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &_Stack_170);
  pEVar3[(long)p_Var14].phiCV.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_168._M_p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&pEVar3[(long)p_Var14].phiCV.
              super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &_Stack_160);
  pEVar3[(long)p_Var14].rcut = (RealType)local_158._M_allocated_capacity;
  pEVar3[(long)p_Var14].nValence = (RealType)CONCAT71(local_158._9_7_,local_158._M_local_buf[8]);
  *(ulong *)((long)&pEVar3[(long)p_Var14].nValence + 1) = CONCAT17(local_148,local_158._9_7_);
  *(ulong *)((long)&pEVar3[(long)p_Var14].nMobile + 1) = CONCAT17(local_140,uStack_147);
  local_330 = (RealType)((long)p_Var14 * 3);
  local_248 = p_Var14;
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (long)p_Var14,(long)this->nEAM_);
  p_Var14 = (this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2d0 = &(this->EAMtypes)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var14 != local_2d0) {
    local_248 = (_Base_ptr)((long)local_248 << 6);
    do {
      iVar13 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(int)p_Var14[1]._M_color];
      lVar16 = (long)iVar13;
      ForceField::getAtomType(this->forceField_,p_Var14[1]._M_color);
      local_218 = (pointer)0x0;
      uStack_210 = 0;
      uStack_20f = 0;
      local_238._16_8_ = (double *)0x0;
      _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_238._0_8_ = (AtomType *)0x0;
      local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      getPhi((EAM *)local_268,(AtomType *)this,local_1b0);
      this_00 = local_238._8_8_;
      local_238._8_8_ = p_Stack_260;
      local_238._0_8_ = local_268;
      local_268 = (undefined1  [8])0x0;
      p_Stack_260 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if (p_Stack_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_260);
      }
      pVar21 = CubicSpline::getLimits((CubicSpline *)local_238._0_8_);
      local_208 = pVar21.second._0_1_;
      uStack_207 = pVar21.second._1_7_;
      local_200 = 0;
      local_360 = p_Var14;
      std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
                ((this->MixingMap).
                 super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar16,(long)this->nEAM_);
      lVar4 = *(long *)((long)&(((this->MixingMap).
                                 super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                               )._M_impl.super__Vector_impl_data + (long)local_330 * 8);
      puVar2 = (undefined8 *)(lVar16 * 0x40 + lVar4);
      *puVar2 = local_238._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 1),
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
      this = local_2b0;
      puVar2[2] = local_238._16_8_;
      lVar4 = lVar16 * 0x40 + lVar4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar4 + 0x18),&_Stack_220);
      p_Var14 = local_248;
      *(pointer *)(lVar4 + 0x20) = local_218;
      *(ulong *)(lVar4 + 0x28) = CONCAT71(uStack_20f,uStack_210);
      *(ulong *)(lVar4 + 0x29) = CONCAT17(local_208,uStack_20f);
      *(ulong *)(lVar4 + 0x31) = CONCAT17(local_200,uStack_207);
      if (iVar13 != local_358._0_4_) {
        lVar16 = *(long *)&(this->MixingMap).
                           super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar16].
                           super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                           ._M_impl.super__Vector_impl_data;
        puVar2 = (undefined8 *)((long)&local_248->_M_color + lVar16);
        *puVar2 = local_238._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 1),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
        puVar2[2] = local_238._16_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&p_Var14->_M_right + lVar16)
                   ,&_Stack_220);
        *(pointer *)((long)&p_Var14[1]._M_color + lVar16) = local_218;
        *(ulong *)((long)&p_Var14[1]._M_parent + lVar16) = CONCAT71(uStack_20f,uStack_210);
        *(ulong *)((long)&p_Var14[1]._M_parent + lVar16 + 1) = CONCAT17(local_208,uStack_20f);
        *(ulong *)((long)&p_Var14[1]._M_left + lVar16 + 1) = CONCAT17(local_200,uStack_207);
      }
      if (_Stack_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_220._M_pi);
      }
      p_Var19 = local_360;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
      }
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    } while (p_Var14 != local_2d0);
  }
  if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
  }
  if (_Stack_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_170._M_pi);
  }
  if (_Stack_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_180._M_pi);
  }
  if (_Stack_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_190._M_pi);
  }
  if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
  }
  return;
}

Assistant:

void EAM::addType(AtomType* atomType) {
    EAMAdapter ea = EAMAdapter(atomType);
    EAMAtomData eamAtomData;
    EAMType et = ea.getEAMType();

    switch (et) {
    case eamFuncfl: {
      eamAtomData.rho  = ea.getRhoSpline();
      eamAtomData.F    = ea.getFSpline();
      eamAtomData.Z    = ea.getZSpline();
      eamAtomData.rcut = ea.getRcut();
      break;
    }
    case eamZhou2001:
    case eamZhou2004:
    case eamZhou2005:
    case eamZhouRose: {
      RealType re              = ea.getRe();
      RealType fe              = ea.get_fe();
      RealType rhoe            = ea.getRhoe();
      RealType A               = ea.getA();
      RealType B               = ea.getB();
      RealType alpha           = ea.getAlpha();
      RealType beta            = ea.getBeta();
      RealType kappa           = ea.getKappa();
      RealType lambda          = ea.getLambda();
      std::vector<RealType> Fn = ea.getFn();
      std::vector<RealType> F  = ea.getF();
      RealType Fe              = ea.getFe();
      RealType eta             = ea.getEta();
      RealType F0              = ea.getF0();
      // RealType latticeConstant = ea.getLatticeConstant();

      int Nr = 2000;
      // eamAtomData.rcut = latticeConstant * sqrt(10.0) / 2.0;
      // eamAtomData.rcut = re * (pow(10.0, 0.3) + lambda);
      eamAtomData.rcut = std::min(12.0, std::max(9.0, 4.0 * re));
      // eamAtomData.rcut = re + (20.0 * re / beta);
      RealType dr = eamAtomData.rcut / (RealType)(Nr - 1);
      RealType r;

      int Nrho = 3000;
      RealType rhomax =
          max(900.0, max(2.0 * rhoe, Rho(0.0, re, fe, beta, lambda)));
      RealType drho = rhomax / (RealType)(Nrho - 1);
      RealType rho;
      RealType phiCC, phiCV;

      std::vector<RealType> rvals;
      std::vector<RealType> zvals;
      std::vector<RealType> ccvals;
      std::vector<RealType> cvvals;

      std::vector<RealType> rhovals;
      std::vector<RealType> funcvals;

      for (int i = 0; i < Nr; i++) {
        r = RealType(i) * dr;
        rvals.push_back(r);
        rhovals.push_back(Rho(r, re, fe, beta, lambda));
        phiCC = PhiCoreCore(r, re, A, alpha, kappa);
        phiCV = PhiCoreValence(r, re, B, beta, lambda);
        ccvals.push_back(phiCC);
        cvvals.push_back(phiCV);
      }
      eamAtomData.rho = std::make_shared<CubicSpline>();
      eamAtomData.rho->addPoints(rvals, rhovals);
      eamAtomData.phiCC = std::make_shared<CubicSpline>();
      eamAtomData.phiCC->addPoints(rvals, ccvals);
      eamAtomData.phiCV = std::make_shared<CubicSpline>();
      eamAtomData.phiCV->addPoints(rvals, cvvals);

      rhovals.clear();
      if (et == eamZhou2001) {
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(Zhou2001Functional(rho, rhoe, Fn, F, Fe, eta));
        }
      } else if (et == eamZhou2004) {
        RealType rhos = ea.getRhos();
        RealType rhol = ea.getRhol();
        RealType rhoh = ea.getRhoh();
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(
              Zhou2004Functional(rho, rhoe, rhos, Fn, F, Fe, eta, rhol, rhoh));
        }
      } else if (et == eamZhou2005) {
        RealType rhos    = ea.getRhos();
        RealType F3plus  = ea.getF3plus();
        RealType F3minus = ea.getF3minus();
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(Zhou2005Functional(rho, rhoe, rhos, Fn, F, F3plus,
                                                F3minus, Fe, eta));
        }
      } else if (et == eamZhouRose) {
        for (int i = 0; i < Nrho; i++) {
          rho = RealType(i) * drho;
          rhovals.push_back(rho);
          funcvals.push_back(RoseFunctional(rho, rhoe, F0));
        }
      }

      eamAtomData.F = std::make_shared<CubicSpline>();
      eamAtomData.F->addPoints(rhovals, funcvals);
      break;
    }
    case eamOxygenFuncfl: {
      RealType re = ea.getRe();
      RealType fe = ea.get_fe();

      RealType A      = ea.getA();
      RealType B      = ea.getB();
      RealType alpha  = ea.getAlpha();
      RealType beta   = ea.getBeta();
      RealType kappa  = ea.getKappa();
      RealType lambda = ea.getLambda();

      // RealType latticeConstant = ea.getLatticeConstant();

      int Nr = 2000;
      // eamAtomData.rcut = latticeConstant * sqrt(10.0) / 2.0;
      // eamAtomData.rcut = re * (pow(10.0, 0.3) + lambda);
      eamAtomData.rcut = std::min(12.0, std::max(9.0, 4.0 * re));
      // eamAtomData.rcut = re + (20.0 * re / beta);
      RealType dr = eamAtomData.rcut / (RealType)(Nr - 1);
      RealType r;
      RealType phiCC, phiCV;

      std::vector<RealType> rvals;
      std::vector<RealType> zvals;
      std::vector<RealType> ccvals;
      std::vector<RealType> cvvals;

      std::vector<RealType> rhovals;

      for (int i = 0; i < Nr; i++) {
        r = RealType(i) * dr;
        rvals.push_back(r);
        rhovals.push_back(Rho(r, re, fe, beta, lambda));
        phiCC = PhiCoreCore(r, re, A, alpha, kappa);
        phiCV = PhiCoreValence(r, re, B, beta, lambda);
        ccvals.push_back(phiCC);
        cvvals.push_back(phiCV);
      }
      eamAtomData.rho = std::make_shared<CubicSpline>();
      eamAtomData.rho->addPoints(rvals, rhovals);
      eamAtomData.phiCC = std::make_shared<CubicSpline>();
      eamAtomData.phiCC->addPoints(rvals, ccvals);
      eamAtomData.phiCV = std::make_shared<CubicSpline>();
      eamAtomData.phiCV->addPoints(rvals, cvvals);

      eamAtomData.F = ea.getFSpline();
      break;
    }
    case eamZhou2005Oxygen: {
      RealType re                           = ea.getRe();
      RealType fe                           = ea.get_fe();
      RealType A                            = ea.getA();
      RealType B                            = ea.getB();
      RealType alpha                        = ea.getAlpha();
      RealType beta                         = ea.getBeta();
      RealType kappa                        = ea.getKappa();
      RealType lambda                       = ea.getLambda();
      RealType gamma                        = ea.getGamma();
      RealType nu                           = ea.getNu();
      std::vector<RealType> OrhoLimits      = ea.getOrhoLimits();
      std::vector<RealType> OrhoE           = ea.getOrhoE();
      std::vector<std::vector<RealType>> OF = ea.getOF();

      int Nr = 2000;
      // eamAtomData.rcut = 6.0;
      // eamAtomData.rcut = re * (pow(10.0, 3.0/10.0) + nu );

      eamAtomData.rcut = std::min(12.0, std::max(9.0, 4.0 * re));
      // eamAtomData.rcut = re + (20.0 * re / beta);
      RealType dr = eamAtomData.rcut / (RealType)(Nr - 1);
      RealType r;

      int Nrho = 3000;
      // RealType rhomax = max(800.0, ZhouRho(0.0, re, fe, gamma, nu));
      RealType rhomax = max(800.0, Rho(0.0, re, fe, gamma, nu));
      RealType drho   = rhomax / (RealType)(Nrho - 1);
      RealType rho, phiCC, phiCV;

      std::vector<RealType> rvals;
      std::vector<RealType> zvals;
      std::vector<RealType> ccvals;
      std::vector<RealType> cvvals;

      std::vector<RealType> rhovals;
      std::vector<RealType> funcvals;

      for (int i = 0; i < Nr; i++) {
        r = RealType(i) * dr;
        rvals.push_back(r);
        rhovals.push_back(Rho(r, re, fe, gamma, nu));
        phiCC = PhiCoreCore(r, re, A, alpha, kappa);
        phiCV = PhiCoreValence(r, re, B, beta, lambda);
        ccvals.push_back(phiCC);
        cvvals.push_back(phiCV);
      }
      eamAtomData.rho = std::make_shared<CubicSpline>();
      eamAtomData.rho->addPoints(rvals, rhovals);
      eamAtomData.phiCC = std::make_shared<CubicSpline>();
      eamAtomData.phiCC->addPoints(rvals, ccvals);
      eamAtomData.phiCV = std::make_shared<CubicSpline>();
      eamAtomData.phiCV->addPoints(rvals, cvvals);

      rhovals.clear();
      for (int i = 0; i < Nrho; i++) {
        rho = RealType(i) * drho;
        rhovals.push_back(rho);
        funcvals.push_back(
            Zhou2005OxygenFunctional(rho, OrhoLimits, OrhoE, OF));
      }

      eamAtomData.F = std::make_shared<CubicSpline>();
      eamAtomData.F->addPoints(rhovals, funcvals);
      break;
    }

    case eamUnknown: {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAM::addType found an unknown EAM type for atomType %s\n",
               atomType->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
      break;
    }
    }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) {
      if (fqa.isMetallic()) {
        eamAtomData.isFluctuatingCharge = true;
        eamAtomData.nValence            = fqa.getNValence();
        eamAtomData.nMobile             = fqa.getNMobile();
      } else {
        eamAtomData.isFluctuatingCharge = false;
      }
    } else {
      eamAtomData.isFluctuatingCharge = false;
    }

    // add it to the map:
    int atid   = atomType->getIdent();
    int eamtid = EAMtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAM already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    EAMtids[atid]   = eamtid;
    EAMdata[eamtid] = eamAtomData;
    MixingMap[eamtid].resize(nEAM_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = EAMtypes.begin(); it != EAMtypes.end(); ++it) {
      int eamtid2      = EAMtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      EAMInteractionData mixer;
      mixer.phi           = getPhi(atomType, atype2);
      mixer.rcut          = mixer.phi->getLimits().second;
      mixer.explicitlySet = false;

      MixingMap[eamtid2].resize(nEAM_);

      MixingMap[eamtid][eamtid2] = mixer;
      if (eamtid2 != eamtid) { MixingMap[eamtid2][eamtid] = mixer; }
    }
    return;
  }